

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

void __thiscall
perfetto::DataSource<perfetto::TrackEvent,_perfetto::internal::TrackEventDataSourceTraits>::
TraceContext::~TraceContext(TraceContext *this)

{
  function<void_()> local_30;
  TraceContext *local_10;
  TraceContext *this_local;
  
  if ((this->tls_inst_->is_intercepted & 1U) != 0) {
    local_10 = this;
    ::std::function<void_()>::function(&local_30);
    Flush(this,&local_30);
    ::std::function<void_()>::~function(&local_30);
  }
  return;
}

Assistant:

~TraceContext() {
      // If the data source is being intercepted, flush the trace writer after
      // each trace point to make sure the interceptor sees the data right away.
      if (PERFETTO_UNLIKELY(tls_inst_->is_intercepted))
        Flush();
    }